

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Unmarshall.c
# Opt level: O0

WJTL_STATUS TestUnmarshallPartialFills(void)

{
  byte bVar1;
  long lVar2;
  _Bool _Var3;
  JL_STATUS JVar4;
  int iVar5;
  bool bVar6;
  _Bool _result_95;
  _Bool _result_94;
  _Bool _result_93;
  _Bool _result_92;
  _Bool _result_91;
  _Bool _result_90;
  _Bool _result_89;
  _Bool _result_88;
  _Bool _result_87;
  _Bool _result_86;
  _Bool _result_85;
  _Bool _result_84;
  _Bool _result_83;
  _Bool _result_82;
  _Bool _result_81;
  _Bool _result_80;
  _Bool _result_79;
  _Bool _result_78;
  _Bool _result_77;
  _Bool _result_76;
  _Bool _result_75;
  _Bool _result_74;
  _Bool _result_73;
  _Bool _result_72;
  _Bool _result_71;
  _Bool _result_70;
  _Bool _result_69;
  _Bool _result_68;
  _Bool _result_67;
  _Bool _result_66;
  _Bool _result_65;
  _Bool _result_64;
  _Bool _result_63;
  _Bool _result_62;
  _Bool _result_61;
  _Bool _result_60;
  _Bool _result_59;
  _Bool _result_58;
  _Bool _result_57;
  _Bool _result_56;
  _Bool _result_55;
  _Bool _result_54;
  _Bool _result_53;
  _Bool _result_52;
  _Bool _result_51;
  _Bool _result_50;
  _Bool _result_49;
  _Bool _result_48;
  _Bool _result_47;
  _Bool _result_46;
  _Bool _result_45;
  _Bool _result_44;
  _Bool _result_43;
  _Bool _result_42;
  _Bool _result_41;
  _Bool _result_40;
  _Bool _result_39;
  _Bool _result_38;
  _Bool _result_37;
  _Bool _result_36;
  _Bool _result_35;
  _Bool _result_34;
  _Bool _result_33;
  _Bool _result_32;
  _Bool _result_31;
  _Bool _result_30;
  _Bool _result_29;
  _Bool _result_28;
  _Bool _result_27;
  _Bool _result_26;
  _Bool _result_25;
  _Bool _result_24;
  _Bool _result_23;
  _Bool _result_22;
  _Bool _result_21;
  _Bool _result_20;
  _Bool _result_19;
  _Bool _result_18;
  _Bool _result_17;
  _Bool _result_16;
  _Bool _result_15;
  _Bool _result_14;
  _Bool _result_13;
  _Bool _result_12;
  _Bool _result_11;
  _Bool _result_10;
  _Bool _result_9;
  _Bool _result_8;
  _Bool _result_7;
  _Bool _result_6;
  _Bool _result_5;
  _Bool _result_4;
  _Bool _result_3;
  _Bool _result_2;
  _Bool _result_1;
  _Bool _result;
  TheStruct theStruct;
  size_t element;
  JlMarshallElement marshalTheStruct [13];
  JlMarshallElement marshalMiniStruct [2];
  size_t errorAtPos;
  WJTL_STATUS TestReturn;
  
  errorAtPos._4_4_ = WJTL_STATUS_SUCCESS;
  marshalMiniStruct[1].ChildStructDescriptionCount = 0;
  marshalMiniStruct[1]._92_4_ = 0;
  memcpy(&marshalTheStruct[0xc].ChildStructDescriptionCount,&DAT_0014f5f0,0xc0);
  element._0_4_ = 1;
  marshalTheStruct[0]._0_8_ = anon_var_dwarf_8c8d;
  marshalTheStruct[0].Name._0_1_ = 0;
  marshalTheStruct[0].IsArray = false;
  marshalTheStruct[0]._17_7_ = 0;
  marshalTheStruct[0].FieldOffset = 10;
  marshalTheStruct[0].FieldSize = 0;
  marshalTheStruct[0].CountFieldOffset = 0;
  marshalTheStruct[0].CountFieldSize = 0;
  marshalTheStruct[0].ArrayFieldSize = 0;
  marshalTheStruct[0].ArrayItemSize._0_4_ = 0;
  marshalTheStruct[0].ArrayItemSize._4_1_ = 0;
  marshalTheStruct[0].ArrayItemSize._5_1_ = 0;
  marshalTheStruct[0].NumberType = JL_NUM_TYPE_NONE;
  marshalTheStruct[0].IsHex = false;
  marshalTheStruct[0].IsBase64 = false;
  marshalTheStruct[0]._78_2_ = 0;
  marshalTheStruct[0].ChildStructDescription._0_4_ = 0;
  memset(&marshalTheStruct[0].ChildStructDescriptionCount,0,0x60);
  marshalTheStruct[0].ChildStructDescriptionCount = 1;
  marshalTheStruct[1]._0_8_ = anon_var_dwarf_8c99;
  marshalTheStruct[1].IsArray = true;
  marshalTheStruct[1]._17_7_ = 0;
  marshalTheStruct[1].ChildStructDescriptionCount = 2;
  marshalTheStruct[2]._0_8_ = (long)"11 == theStruct.SubVarList[0].SubSubVarList[0].Num" + 0x2f;
  marshalTheStruct[2].Name._0_1_ = 0;
  marshalTheStruct[2].IsArray = true;
  marshalTheStruct[2]._17_7_ = 0;
  marshalTheStruct[2].FieldOffset = 4;
  marshalTheStruct[2].FieldSize = 0;
  marshalTheStruct[2].CountFieldOffset = 0;
  marshalTheStruct[2].CountFieldSize = 0;
  marshalTheStruct[2].ArrayFieldSize = 0;
  marshalTheStruct[2].ArrayItemSize._0_4_ = 10;
  marshalTheStruct[2].ArrayItemSize._4_1_ = 0;
  marshalTheStruct[2].ArrayItemSize._5_1_ = 0;
  marshalTheStruct[2].NumberType = JL_NUM_TYPE_NONE;
  marshalTheStruct[2].IsHex = false;
  marshalTheStruct[2].IsBase64 = false;
  marshalTheStruct[2]._78_2_ = 0;
  marshalTheStruct[2].ChildStructDescription._0_4_ = 0;
  marshalTheStruct[2].ChildStructDescriptionCount = 3;
  marshalTheStruct[3]._0_8_ = (long)"!theStruct.Bool1" + 0xb;
  marshalTheStruct[3].Name._0_1_ = 0;
  marshalTheStruct[3].IsArray = true;
  marshalTheStruct[3]._17_7_ = 0;
  marshalTheStruct[3].FieldOffset = 1;
  marshalTheStruct[3].FieldSize = 0;
  marshalTheStruct[3].CountFieldOffset = 0;
  marshalTheStruct[3].CountFieldSize = 0;
  marshalTheStruct[3].ArrayFieldSize = 0;
  marshalTheStruct[3].ArrayItemSize._0_4_ = 0;
  marshalTheStruct[3].ArrayItemSize._4_1_ = 0;
  marshalTheStruct[3].ArrayItemSize._5_1_ = 0;
  marshalTheStruct[3].NumberType = JL_NUM_TYPE_NONE;
  marshalTheStruct[3].IsHex = false;
  marshalTheStruct[3].IsBase64 = false;
  marshalTheStruct[3]._78_2_ = 0;
  marshalTheStruct[3].ChildStructDescription._0_4_ = 0;
  marshalTheStruct[3].ChildStructDescriptionCount = 3;
  marshalTheStruct[4]._0_8_ = (long)"!theStruct.Bool2" + 0xb;
  marshalTheStruct[4].Name._0_1_ = 0;
  marshalTheStruct[4].IsArray = true;
  marshalTheStruct[4]._17_7_ = 0;
  marshalTheStruct[4].FieldOffset = 1;
  marshalTheStruct[4].FieldSize = 0;
  marshalTheStruct[4].CountFieldOffset = 0;
  marshalTheStruct[4].CountFieldSize = 0;
  marshalTheStruct[4].ArrayFieldSize = 0;
  marshalTheStruct[4].ArrayItemSize._0_4_ = 0;
  marshalTheStruct[4].ArrayItemSize._4_1_ = 0;
  marshalTheStruct[4].ArrayItemSize._5_1_ = 0;
  marshalTheStruct[4].NumberType = JL_NUM_TYPE_NONE;
  marshalTheStruct[4].IsHex = false;
  marshalTheStruct[4].IsBase64 = false;
  marshalTheStruct[4]._78_2_ = 0;
  marshalTheStruct[4].ChildStructDescription._0_4_ = 0;
  marshalTheStruct[4].ChildStructDescriptionCount = 1;
  marshalTheStruct[5]._0_8_ = anon_var_dwarf_8cc9;
  marshalTheStruct[5].Name._0_1_ = 1;
  marshalTheStruct[5].IsArray = true;
  marshalTheStruct[5]._17_7_ = 0;
  marshalTheStruct[5].FieldOffset = 0;
  marshalTheStruct[5].FieldSize = 0x28;
  marshalTheStruct[5].CountFieldOffset = 8;
  marshalTheStruct[5].CountFieldSize = 0;
  marshalTheStruct[5].ArrayFieldSize = 8;
  marshalTheStruct[5].ArrayItemSize._0_4_ = 0;
  marshalTheStruct[5].ArrayItemSize._4_1_ = 0;
  marshalTheStruct[5].ArrayItemSize._5_1_ = 0;
  marshalTheStruct[5].NumberType = JL_NUM_TYPE_NONE;
  marshalTheStruct[5].IsHex = false;
  marshalTheStruct[5].IsBase64 = false;
  marshalTheStruct[5]._78_2_ = 0;
  marshalTheStruct[5].ChildStructDescription._0_4_ = 0;
  marshalTheStruct[5].ChildStructDescriptionCount = 1;
  marshalTheStruct[6]._0_8_ = anon_var_dwarf_8cd5;
  marshalTheStruct[6].Name._0_1_ = 1;
  marshalTheStruct[6].IsArray = true;
  marshalTheStruct[6]._17_7_ = 0;
  marshalTheStruct[6].FieldOffset = 0;
  marshalTheStruct[6].FieldSize = 0x50;
  marshalTheStruct[6].CountFieldOffset = 8;
  marshalTheStruct[6].CountFieldSize = 0x20;
  marshalTheStruct[6].ArrayFieldSize = 8;
  marshalTheStruct[6].ArrayItemSize._0_4_ = 0;
  marshalTheStruct[6].ArrayItemSize._4_1_ = 0;
  marshalTheStruct[6].ArrayItemSize._5_1_ = 0;
  marshalTheStruct[6].NumberType = JL_NUM_TYPE_NONE;
  marshalTheStruct[6].IsHex = false;
  marshalTheStruct[6].IsBase64 = false;
  marshalTheStruct[6]._78_2_ = 0;
  marshalTheStruct[6].ChildStructDescription._0_4_ = 0;
  marshalTheStruct[6].ChildStructDescriptionCount = 2;
  marshalTheStruct[7]._0_8_ = anon_var_dwarf_8ce1;
  marshalTheStruct[7].Name._0_1_ = 1;
  marshalTheStruct[7].IsArray = true;
  marshalTheStruct[7]._17_7_ = 0;
  marshalTheStruct[7].FieldOffset = 4;
  marshalTheStruct[7].FieldSize = 0x60;
  marshalTheStruct[7].CountFieldOffset = 8;
  marshalTheStruct[7].CountFieldSize = 0;
  marshalTheStruct[7].ArrayFieldSize = 4;
  marshalTheStruct[7].ArrayItemSize._0_4_ = 10;
  marshalTheStruct[7].ArrayItemSize._4_1_ = 0;
  marshalTheStruct[7].ArrayItemSize._5_1_ = 0;
  marshalTheStruct[7].NumberType = JL_NUM_TYPE_NONE;
  marshalTheStruct[7].IsHex = false;
  marshalTheStruct[7].IsBase64 = false;
  marshalTheStruct[7]._78_2_ = 0;
  marshalTheStruct[7].ChildStructDescription._0_4_ = 0;
  marshalTheStruct[7].ChildStructDescriptionCount = 2;
  marshalTheStruct[8]._0_8_ = anon_var_dwarf_8ced;
  marshalTheStruct[8].Name._0_1_ = 1;
  marshalTheStruct[8].IsArray = true;
  marshalTheStruct[8]._17_7_ = 0;
  marshalTheStruct[8].FieldOffset = 4;
  marshalTheStruct[8].FieldSize = 0x78;
  marshalTheStruct[8].CountFieldOffset = 8;
  marshalTheStruct[8].CountFieldSize = 0x10;
  marshalTheStruct[8].ArrayFieldSize = 4;
  marshalTheStruct[8].ArrayItemSize._0_4_ = 10;
  marshalTheStruct[8].ArrayItemSize._4_1_ = 0;
  marshalTheStruct[8].ArrayItemSize._5_1_ = 0;
  marshalTheStruct[8].NumberType = JL_NUM_TYPE_NONE;
  marshalTheStruct[8].IsHex = false;
  marshalTheStruct[8].IsBase64 = false;
  marshalTheStruct[8]._78_2_ = 0;
  marshalTheStruct[8].ChildStructDescription._0_4_ = 0;
  marshalTheStruct[8].ChildStructDescriptionCount = 3;
  marshalTheStruct[9]._0_8_ = anon_var_dwarf_8cf9;
  marshalTheStruct[9].Name._0_1_ = 1;
  marshalTheStruct[9].IsArray = true;
  marshalTheStruct[9]._17_7_ = 0;
  marshalTheStruct[9].FieldOffset = 1;
  marshalTheStruct[9].FieldSize = 0x88;
  marshalTheStruct[9].CountFieldOffset = 8;
  marshalTheStruct[9].CountFieldSize = 0;
  marshalTheStruct[9].ArrayFieldSize = 1;
  marshalTheStruct[9].ArrayItemSize._0_4_ = 0;
  marshalTheStruct[9].ArrayItemSize._4_1_ = 0;
  marshalTheStruct[9].ArrayItemSize._5_1_ = 0;
  marshalTheStruct[9].NumberType = JL_NUM_TYPE_NONE;
  marshalTheStruct[9].IsHex = false;
  marshalTheStruct[9].IsBase64 = false;
  marshalTheStruct[9]._78_2_ = 0;
  marshalTheStruct[9].ChildStructDescription._0_4_ = 0;
  marshalTheStruct[9].ChildStructDescriptionCount = 3;
  marshalTheStruct[10]._0_8_ = anon_var_dwarf_8d05;
  marshalTheStruct[10].Name._0_1_ = 1;
  marshalTheStruct[10].IsArray = true;
  marshalTheStruct[10]._17_7_ = 0;
  marshalTheStruct[10].FieldOffset = 1;
  marshalTheStruct[10].FieldSize = 0x98;
  marshalTheStruct[10].CountFieldOffset = 8;
  marshalTheStruct[10].CountFieldSize = 4;
  marshalTheStruct[10].ArrayFieldSize = 1;
  marshalTheStruct[10].ArrayItemSize._0_4_ = 0;
  marshalTheStruct[10].ArrayItemSize._4_1_ = 0;
  marshalTheStruct[10].ArrayItemSize._5_1_ = 0;
  marshalTheStruct[10].NumberType = JL_NUM_TYPE_NONE;
  marshalTheStruct[10].IsHex = false;
  marshalTheStruct[10].IsBase64 = false;
  marshalTheStruct[10]._78_2_ = 0;
  marshalTheStruct[10].ChildStructDescription._0_4_ = 0;
  marshalTheStruct[10].ChildStructDescriptionCount = 5;
  marshalTheStruct[0xb]._0_8_ = anon_var_dwarf_8d11;
  marshalTheStruct[0xb].Name._0_1_ = 1;
  marshalTheStruct[0xb].IsArray = true;
  marshalTheStruct[0xb]._17_7_ = 0;
  marshalTheStruct[0xb].FieldOffset = 8;
  marshalTheStruct[0xb].FieldSize = 0xa8;
  marshalTheStruct[0xb].CountFieldOffset = 8;
  marshalTheStruct[0xb].CountFieldSize = 0;
  marshalTheStruct[0xb].ArrayFieldSize = 0x10;
  marshalTheStruct[0xb].ArrayItemSize._0_4_ = 0;
  marshalTheStruct[0xb].ArrayItemSize._4_1_ = 0;
  marshalTheStruct[0xb].ArrayItemSize._5_1_ = 0;
  marshalTheStruct[0xb]._72_8_ = &marshalTheStruct[0xc].ChildStructDescriptionCount;
  marshalTheStruct[0xb].ChildStructDescription._0_4_ = 2;
  marshalTheStruct[0xb].ChildStructDescriptionCount = 5;
  marshalTheStruct[0xc]._0_8_ = anon_var_dwarf_8a40;
  marshalTheStruct[0xc].Name._0_1_ = 1;
  marshalTheStruct[0xc].IsArray = true;
  marshalTheStruct[0xc]._17_7_ = 0;
  marshalTheStruct[0xc].FieldOffset = 0x40;
  marshalTheStruct[0xc].FieldSize = 0xf0;
  marshalTheStruct[0xc].CountFieldOffset = 8;
  marshalTheStruct[0xc].CountFieldSize = 0x40;
  marshalTheStruct[0xc].ArrayFieldSize = 0x10;
  marshalTheStruct[0xc].ArrayItemSize._0_4_ = 0;
  marshalTheStruct[0xc].ArrayItemSize._4_1_ = 0;
  marshalTheStruct[0xc].ArrayItemSize._5_1_ = 0;
  marshalTheStruct[0xc]._72_8_ = &marshalTheStruct[0xc].ChildStructDescriptionCount;
  marshalTheStruct[0xc].ChildStructDescription._0_4_ = 2;
  for (theStruct.StructFixArrayCount = 1; theStruct.StructFixArrayCount < 0xd;
      theStruct.StructFixArrayCount = theStruct.StructFixArrayCount + 1) {
    memset(&_result_7,0,0xf8);
    JVar4 = JlJsonToStruct("{ \"FixStr\":\"FixStr\", \"VarStr\":\"VarStr\", \"Num\":1234, \"Bool1\":true, \"Bool2\":false, \"StrVarList\":[\"StrVarList1\",\"StrVarList2\"], \"StrFixList\":[\"StrFixList1\",\"StrFixList2\"], \"NumVarList\":[101,102], \"NumFixList\":[201,202], \"BoolVarList\":[true,false,true], \"BoolFixList\":[true,false,true], \"MiniVarList\": [ {\"XNum\":301,\"XStr\":\"301\"}, {\"XNum\":401,\"XStr\":\"401\"} ], \"MiniFixList\": [ {\"XNum\":501,\"XStr\":\"501\"}, {\"XNum\":601,\"XStr\":\"601\"} ] }"
                           ,(JlMarshallElement *)&element,0xd,&_result_7,
                           (size_t *)&marshalMiniStruct[1].ChildStructDescriptionCount);
    WjTestLib_Assert(JVar4 == JL_STATUS_SUCCESS,
                     "((JL_STATUS)(JlJsonToStruct( \"{ \\\"FixStr\\\":\\\"FixStr\\\", \\\"VarStr\\\":\\\"VarStr\\\", \\\"Num\\\":1234, \\\"Bool1\\\":true, \\\"Bool2\\\":false,\" \" \\\"StrVarList\\\":[\\\"StrVarList1\\\",\\\"StrVarList2\\\"], \\\"StrFixList\\\":[\\\"StrFixList1\\\",\\\"StrFixList2\\\"],\" \" \\\"NumVarList\\\":[101,102], \\\"NumFixList\\\":[201,202], \\\"BoolVarList\\\":[true,false,true],\" \" \\\"BoolFixList\\\":[true,false,true],\" \" \\\"MiniVarList\\\": [ {\\\"XNum\\\":301,\\\"XStr\\\":\\\"301\\\"}, {\\\"XNum\\\":401,\\\"XStr\\\":\\\"401\\\"} ],\" \" \\\"MiniFixList\\\": [ {\\\"XNum\\\":501,\\\"XStr\\\":\\\"501\\\"}, {\\\"XNum\\\":601,\\\"XStr\\\":\\\"601\\\"} ] }\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                     ,"TestUnmarshallPartialFills",0x486);
    if (JVar4 != JL_STATUS_SUCCESS) {
      errorAtPos._4_4_ = WJTL_STATUS_FAILED;
    }
    bVar6 = marshalMiniStruct[1]._88_8_ == 0;
    WjTestLib_Assert(bVar6,"0 == errorAtPos",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                     ,"TestUnmarshallPartialFills",0x487);
    if (!bVar6) {
      errorAtPos._4_4_ = WJTL_STATUS_FAILED;
    }
    switch(theStruct.StructFixArrayCount) {
    case 1:
      JVar4 = JlJsonToStruct("{\"FixStr\":\"XXXX\"}",(JlMarshallElement *)&element,0xd,&_result_7,
                             (size_t *)&marshalMiniStruct[1].ChildStructDescriptionCount);
      WjTestLib_Assert(JVar4 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlJsonToStruct( \"{\\\"FixStr\\\":\\\"XXXX\\\"}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x48c);
      if (JVar4 != JL_STATUS_SUCCESS) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      iVar5 = strcmp(&_result_7,"XXXX");
      WjTestLib_Assert(iVar5 == 0,"strcmp( theStruct.FixStr, \"XXXX\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x48d);
      if (iVar5 != 0) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      break;
    case 2:
      JVar4 = JlJsonToStruct("{\"VarStr\":\"XXXX\"}",(JlMarshallElement *)&element,0xd,&_result_7,
                             (size_t *)&marshalMiniStruct[1].ChildStructDescriptionCount);
      WjTestLib_Assert(JVar4 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlJsonToStruct( \"{\\\"VarStr\\\":\\\"XXXX\\\"}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x490);
      if (JVar4 != JL_STATUS_SUCCESS) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      iVar5 = strcmp((char *)theStruct._8_8_,"XXXX");
      WjTestLib_Assert(iVar5 == 0,"strcmp( theStruct.VarStr, \"XXXX\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x491);
      if (iVar5 != 0) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      break;
    case 3:
      JVar4 = JlJsonToStruct("{\"Num\":9999}",(JlMarshallElement *)&element,0xd,&_result_7,
                             (size_t *)&marshalMiniStruct[1].ChildStructDescriptionCount);
      WjTestLib_Assert(JVar4 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlJsonToStruct( \"{\\\"Num\\\":9999}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x494);
      if (JVar4 != JL_STATUS_SUCCESS) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      bVar6 = (int)theStruct.VarStr == 9999;
      WjTestLib_Assert(bVar6,"9999 == theStruct.Num",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x495);
      if (!bVar6) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      break;
    case 4:
      JVar4 = JlJsonToStruct("{\"Bool1\":false,\"Bool2\":true}",(JlMarshallElement *)&element,0xd,
                             &_result_7,(size_t *)&marshalMiniStruct[1].ChildStructDescriptionCount)
      ;
      WjTestLib_Assert(JVar4 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlJsonToStruct( \"{\\\"Bool1\\\":false,\\\"Bool2\\\":true}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x498);
      if (JVar4 != JL_STATUS_SUCCESS) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      _Var3 = (_Bool)((theStruct.VarStr._4_1_ ^ 0xff) & 1);
      WjTestLib_Assert(_Var3,"!theStruct.Bool1",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x499);
      if (_Var3 == false) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      _Var3 = (_Bool)(theStruct.VarStr._5_1_ & 1);
      WjTestLib_Assert(_Var3,"theStruct.Bool2",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x49a);
      if (_Var3 == false) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      break;
    case 5:
      JVar4 = JlJsonToStruct("{\"StrVarList\":[\"a\",\"b\",\"c\"]}",(JlMarshallElement *)&element,
                             0xd,&_result_7,
                             (size_t *)&marshalMiniStruct[1].ChildStructDescriptionCount);
      WjTestLib_Assert(JVar4 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlJsonToStruct( \"{\\\"StrVarList\\\":[\\\"a\\\",\\\"b\\\",\\\"c\\\"]}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x49d);
      if (JVar4 != JL_STATUS_SUCCESS) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      bVar6 = theStruct.StrArray == (char **)0x3;
      WjTestLib_Assert(bVar6,"3 == theStruct.StrArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x49e);
      if (!bVar6) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      iVar5 = strcmp(*(char **)theStruct._24_8_,"a");
      WjTestLib_Assert(iVar5 == 0,"strcmp( theStruct.StrArray[0], \"a\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x49f);
      if (iVar5 != 0) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      iVar5 = strcmp(*(char **)(theStruct._24_8_ + 8),"b");
      WjTestLib_Assert(iVar5 == 0,"strcmp( theStruct.StrArray[1], \"b\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4a0);
      if (iVar5 != 0) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      iVar5 = strcmp(*(char **)(theStruct._24_8_ + 0x10),"c");
      WjTestLib_Assert(iVar5 == 0,"strcmp( theStruct.StrArray[2], \"c\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4a1);
      if (iVar5 != 0) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      break;
    case 6:
      JVar4 = JlJsonToStruct("{\"StrFixList\":[\"a\",\"b\",\"c\"]}",(JlMarshallElement *)&element,
                             0xd,&_result_7,
                             (size_t *)&marshalMiniStruct[1].ChildStructDescriptionCount);
      WjTestLib_Assert(JVar4 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlJsonToStruct( \"{\\\"StrFixList\\\":[\\\"a\\\",\\\"b\\\",\\\"c\\\"]}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4a4);
      if (JVar4 != JL_STATUS_SUCCESS) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      bVar6 = theStruct.StrFixArray[3] == (char *)0x3;
      WjTestLib_Assert(bVar6,"3 == theStruct.StrFixArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4a5);
      if (!bVar6) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      iVar5 = strcmp((char *)theStruct.StrArrayCount,"a");
      WjTestLib_Assert(iVar5 == 0,"strcmp( theStruct.StrFixArray[0], \"a\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4a6);
      if (iVar5 != 0) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      iVar5 = strcmp(theStruct.StrFixArray[0],"b");
      WjTestLib_Assert(iVar5 == 0,"strcmp( theStruct.StrFixArray[1], \"b\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4a7);
      if (iVar5 != 0) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      iVar5 = strcmp(theStruct.StrFixArray[1],"c");
      WjTestLib_Assert(iVar5 == 0,"strcmp( theStruct.StrFixArray[2], \"c\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4a8);
      if (iVar5 != 0) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      break;
    case 7:
      JVar4 = JlJsonToStruct("{\"NumVarList\":[10,20,30]}",(JlMarshallElement *)&element,0xd,
                             &_result_7,(size_t *)&marshalMiniStruct[1].ChildStructDescriptionCount)
      ;
      WjTestLib_Assert(JVar4 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlJsonToStruct( \"{\\\"NumVarList\\\":[10,20,30]}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4ab);
      if (JVar4 != JL_STATUS_SUCCESS) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      bVar6 = theStruct.NumVarArray == (uint32_t *)0x3;
      WjTestLib_Assert(bVar6,"3 == theStruct.NumVarArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4ac);
      if (!bVar6) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      iVar5 = *(int *)theStruct.StrFixArrayCount;
      WjTestLib_Assert(iVar5 == 10,"10 == theStruct.NumVarArray[0]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4ad);
      if (iVar5 != 10) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      bVar6 = *(int *)(theStruct.StrFixArrayCount + 4) == 0x14;
      WjTestLib_Assert(bVar6,"20 == theStruct.NumVarArray[1]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4ae);
      if (!bVar6) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      bVar6 = *(int *)(theStruct.StrFixArrayCount + 8) == 0x1e;
      WjTestLib_Assert(bVar6,"30 == theStruct.NumVarArray[2]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4af);
      if (!bVar6) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      break;
    case 8:
      JVar4 = JlJsonToStruct("{\"NumFixList\":[10,20,30]}",(JlMarshallElement *)&element,0xd,
                             &_result_7,(size_t *)&marshalMiniStruct[1].ChildStructDescriptionCount)
      ;
      WjTestLib_Assert(JVar4 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlJsonToStruct( \"{\\\"NumFixList\\\":[10,20,30]}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4b2);
      if (JVar4 != JL_STATUS_SUCCESS) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      bVar6 = theStruct.NumFixArray._8_8_ == 3;
      WjTestLib_Assert(bVar6,"3 == theStruct.NumFixArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4b3);
      if (!bVar6) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      bVar6 = (int)theStruct.NumVarArrayCount == 10;
      WjTestLib_Assert(bVar6,"10 == theStruct.NumFixArray[0]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4b4);
      if (!bVar6) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      bVar6 = theStruct.NumVarArrayCount._4_4_ == 0x14;
      WjTestLib_Assert(bVar6,"20 == theStruct.NumFixArray[1]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4b5);
      if (!bVar6) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      bVar6 = theStruct.NumFixArray[0] == 0x1e;
      WjTestLib_Assert(bVar6,"30 == theStruct.NumFixArray[2]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4b6);
      if (!bVar6) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      break;
    case 9:
      JVar4 = JlJsonToStruct("{\"BoolVarList\":[false,true,false,true]}",
                             (JlMarshallElement *)&element,0xd,&_result_7,
                             (size_t *)&marshalMiniStruct[1].ChildStructDescriptionCount);
      WjTestLib_Assert(JVar4 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlJsonToStruct( \"{\\\"BoolVarList\\\":[false,true,false,true]}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4b9);
      if (JVar4 != JL_STATUS_SUCCESS) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      bVar6 = theStruct.BoolVarArray == (_Bool *)0x4;
      WjTestLib_Assert(bVar6,"4 == theStruct.BoolVarArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4ba);
      if (!bVar6) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      _Var3 = (_Bool)((*(byte *)theStruct.NumFixArrayCount ^ 0xff) & 1);
      WjTestLib_Assert(_Var3,"!theStruct.BoolVarArray[0]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4bb);
      if (_Var3 == false) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      _Var3 = (_Bool)(*(byte *)(theStruct.NumFixArrayCount + 1) & 1);
      WjTestLib_Assert(_Var3,"theStruct.BoolVarArray[1]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4bc);
      if (_Var3 == false) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      _Var3 = (_Bool)((*(byte *)(theStruct.NumFixArrayCount + 2) ^ 0xff) & 1);
      WjTestLib_Assert(_Var3,"!theStruct.BoolVarArray[2]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4bd);
      if (_Var3 == false) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      _Var3 = (_Bool)(*(byte *)(theStruct.NumFixArrayCount + 3) & 1);
      WjTestLib_Assert(_Var3,"theStruct.BoolVarArray[3]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4be);
      if (_Var3 == false) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      break;
    case 10:
      JVar4 = JlJsonToStruct("{\"BoolFixList\":[false,true,false,true]}",
                             (JlMarshallElement *)&element,0xd,&_result_7,
                             (size_t *)&marshalMiniStruct[1].ChildStructDescriptionCount);
      WjTestLib_Assert(JVar4 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlJsonToStruct( \"{\\\"BoolFixList\\\":[false,true,false,true]}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4c1);
      if (JVar4 != JL_STATUS_SUCCESS) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      bVar6 = theStruct._144_8_ == 4;
      WjTestLib_Assert(bVar6,"4 == theStruct.BoolFixArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4c2);
      if (!bVar6) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      _Var3 = (_Bool)(((byte)theStruct.BoolVarArrayCount ^ 0xff) & 1);
      WjTestLib_Assert(_Var3,"!theStruct.BoolFixArray[0]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4c3);
      if (_Var3 == false) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      _Var3 = (_Bool)(theStruct.BoolVarArrayCount._1_1_ & 1);
      WjTestLib_Assert(_Var3,"theStruct.BoolFixArray[1]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4c4);
      if (_Var3 == false) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      _Var3 = (_Bool)((theStruct.BoolVarArrayCount._2_1_ ^ 0xff) & 1);
      WjTestLib_Assert(_Var3,"!theStruct.BoolFixArray[2]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4c5);
      if (_Var3 == false) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      _Var3 = (_Bool)(theStruct.BoolVarArrayCount._3_1_ & 1);
      WjTestLib_Assert(_Var3,"theStruct.BoolFixArray[3]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4c6);
      if (_Var3 == false) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      break;
    case 0xb:
      JVar4 = JlJsonToStruct("{\"MiniVarList\": [ {\"XNum\":777,\"XStr\":\"777\"}, {\"XNum\":888,\"XStr\":\"888\"}, {\"XNum\":999,\"XStr\":\"999\"} ]}"
                             ,(JlMarshallElement *)&element,0xd,&_result_7,
                             (size_t *)&marshalMiniStruct[1].ChildStructDescriptionCount);
      WjTestLib_Assert(JVar4 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlJsonToStruct( \"{\\\"MiniVarList\\\": [ {\\\"XNum\\\":777,\\\"XStr\\\":\\\"777\\\"}, {\\\"XNum\\\":888,\\\"XStr\\\":\\\"888\\\"}, {\\\"XNum\\\":999,\\\"XStr\\\":\\\"999\\\"} ]}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4c9);
      if (JVar4 != JL_STATUS_SUCCESS) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      bVar6 = theStruct.StructVarArray == (MiniStruct *)0x3;
      WjTestLib_Assert(bVar6,"3 == theStruct.StructVarArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4ca);
      if (!bVar6) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      lVar2 = *(long *)theStruct.BoolFixArrayCount;
      WjTestLib_Assert(lVar2 == 0x309,"777 == theStruct.StructVarArray[0].XNum",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4cb);
      if (lVar2 != 0x309) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      iVar5 = strcmp(*(char **)(theStruct.BoolFixArrayCount + 8),"777");
      WjTestLib_Assert(iVar5 == 0,"strcmp( theStruct.StructVarArray[0].XStr, \"777\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4cc);
      if (iVar5 != 0) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      bVar6 = *(long *)(theStruct.BoolFixArrayCount + 0x10) == 0x378;
      WjTestLib_Assert(bVar6,"888 == theStruct.StructVarArray[1].XNum",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4cd);
      if (!bVar6) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      iVar5 = strcmp(*(char **)(theStruct.BoolFixArrayCount + 0x18),"888");
      WjTestLib_Assert(iVar5 == 0,"strcmp( theStruct.StructVarArray[1].XStr, \"888\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4ce);
      if (iVar5 != 0) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      bVar6 = *(long *)(theStruct.BoolFixArrayCount + 0x20) == 999;
      WjTestLib_Assert(bVar6,"999 == theStruct.StructVarArray[2].XNum",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4cf);
      if (!bVar6) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      iVar5 = strcmp(*(char **)(theStruct.BoolFixArrayCount + 0x28),"999");
      WjTestLib_Assert(iVar5 == 0,"strcmp( theStruct.StructVarArray[2].XStr, \"999\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4d0);
      if (iVar5 != 0) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      break;
    case 0xc:
      JVar4 = JlJsonToStruct("{\"MiniFixList\": [ {\"XNum\":777,\"XStr\":\"777\"}, {\"XNum\":888,\"XStr\":\"888\"}, {\"XNum\":999,\"XStr\":\"999\"} ]}"
                             ,(JlMarshallElement *)&element,0xd,&_result_7,
                             (size_t *)&marshalMiniStruct[1].ChildStructDescriptionCount);
      WjTestLib_Assert(JVar4 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlJsonToStruct( \"{\\\"MiniFixList\\\": [ {\\\"XNum\\\":777,\\\"XStr\\\":\\\"777\\\"}, {\\\"XNum\\\":888,\\\"XStr\\\":\\\"888\\\"}, {\\\"XNum\\\":999,\\\"XStr\\\":\\\"999\\\"} ]}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4d3);
      if (JVar4 != JL_STATUS_SUCCESS) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      bVar6 = theStruct.StructFixArray[3].XStr == (char *)0x3;
      WjTestLib_Assert(bVar6,"3 == theStruct.StructFixArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4d4);
      if (!bVar6) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      bVar6 = theStruct.StructVarArrayCount == 0x309;
      WjTestLib_Assert(bVar6,"777 == theStruct.StructFixArray[0].XNum",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4d5);
      if (!bVar6) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      iVar5 = strcmp((char *)theStruct.StructFixArray[0].XNum,"777");
      WjTestLib_Assert(iVar5 == 0,"strcmp( theStruct.StructFixArray[0].XStr, \"777\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4d6);
      if (iVar5 != 0) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      bVar6 = theStruct.StructFixArray[0].XStr == (char *)0x378;
      WjTestLib_Assert(bVar6,"888 == theStruct.StructFixArray[1].XNum",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4d7);
      if (!bVar6) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      iVar5 = strcmp((char *)theStruct.StructFixArray[1].XNum,"888");
      WjTestLib_Assert(iVar5 == 0,"strcmp( theStruct.StructFixArray[1].XStr, \"888\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4d8);
      if (iVar5 != 0) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      bVar6 = theStruct.StructFixArray[1].XStr == (char *)0x3e7;
      WjTestLib_Assert(bVar6,"999 == theStruct.StructFixArray[2].XNum",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4d9);
      if (!bVar6) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      iVar5 = strcmp((char *)theStruct.StructFixArray[2].XNum,"999");
      WjTestLib_Assert(iVar5 == 0,"strcmp( theStruct.StructFixArray[2].XStr, \"999\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4da);
      if (iVar5 != 0) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      break;
    default:
      WjTestLib_Assert(false,"false",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4dd);
      errorAtPos._4_4_ = WJTL_STATUS_FAILED;
    }
    if (theStruct.StructFixArrayCount != 1) {
      iVar5 = strcmp(&_result_7,"FixStr");
      WjTestLib_Assert(iVar5 == 0,"strcmp( theStruct.FixStr, \"FixStr\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4e2);
      if (iVar5 != 0) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
    }
    if (theStruct.StructFixArrayCount != 2) {
      iVar5 = strcmp((char *)theStruct._8_8_,"VarStr");
      WjTestLib_Assert(iVar5 == 0,"strcmp( theStruct.VarStr, \"VarStr\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4e3);
      if (iVar5 != 0) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
    }
    if ((theStruct.StructFixArrayCount != 3) &&
       (bVar6 = (int)theStruct.VarStr == 0x4d2,
       WjTestLib_Assert(bVar6,"1234 == theStruct.Num",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                        ,"TestUnmarshallPartialFills",0x4e4), !bVar6)) {
      errorAtPos._4_4_ = WJTL_STATUS_FAILED;
    }
    if (theStruct.StructFixArrayCount != 4) {
      _Var3 = (_Bool)(theStruct.VarStr._4_1_ & 1);
      WjTestLib_Assert(_Var3,"theStruct.Bool1",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4e6);
      if (_Var3 == false) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      _Var3 = (_Bool)((theStruct.VarStr._5_1_ ^ 0xff) & 1);
      WjTestLib_Assert(_Var3,"!theStruct.Bool2",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4e7);
      if (_Var3 == false) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
    }
    if (theStruct.StructFixArrayCount != 5) {
      bVar6 = theStruct.StrArray == (char **)0x2;
      WjTestLib_Assert(bVar6,"2 == theStruct.StrArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4ea);
      if (!bVar6) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      iVar5 = strcmp(*(char **)theStruct._24_8_,"StrVarList1");
      WjTestLib_Assert(iVar5 == 0,"strcmp( theStruct.StrArray[0], \"StrVarList1\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4eb);
      if (iVar5 != 0) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      iVar5 = strcmp(*(char **)(theStruct._24_8_ + 8),"StrVarList2");
      WjTestLib_Assert(iVar5 == 0,"strcmp( theStruct.StrArray[1], \"StrVarList2\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4ec);
      if (iVar5 != 0) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
    }
    if (theStruct.StructFixArrayCount != 6) {
      bVar6 = theStruct.StrFixArray[3] == (char *)0x2;
      WjTestLib_Assert(bVar6,"2 == theStruct.StrFixArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4ef);
      if (!bVar6) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      iVar5 = strcmp((char *)theStruct.StrArrayCount,"StrFixList1");
      WjTestLib_Assert(iVar5 == 0,"strcmp( theStruct.StrFixArray[0], \"StrFixList1\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4f0);
      if (iVar5 != 0) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      iVar5 = strcmp(theStruct.StrFixArray[0],"StrFixList2");
      WjTestLib_Assert(iVar5 == 0,"strcmp( theStruct.StrFixArray[1], \"StrFixList2\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4f1);
      if (iVar5 != 0) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
    }
    if (theStruct.StructFixArrayCount != 7) {
      bVar6 = theStruct.NumVarArray == (uint32_t *)0x2;
      WjTestLib_Assert(bVar6,"2 == theStruct.NumVarArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4f4);
      if (!bVar6) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      iVar5 = *(int *)theStruct.StrFixArrayCount;
      WjTestLib_Assert(iVar5 == 0x65,"101 == theStruct.NumVarArray[0]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4f5);
      if (iVar5 != 0x65) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      bVar6 = *(int *)(theStruct.StrFixArrayCount + 4) == 0x66;
      WjTestLib_Assert(bVar6,"102 == theStruct.NumVarArray[1]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4f6);
      if (!bVar6) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
    }
    if (theStruct.StructFixArrayCount != 8) {
      bVar6 = theStruct.NumFixArray._8_8_ == 2;
      WjTestLib_Assert(bVar6,"2 == theStruct.NumFixArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4f9);
      if (!bVar6) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      bVar6 = (int)theStruct.NumVarArrayCount == 0xc9;
      WjTestLib_Assert(bVar6,"201 == theStruct.NumFixArray[0]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4fa);
      if (!bVar6) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      bVar6 = theStruct.NumVarArrayCount._4_4_ == 0xca;
      WjTestLib_Assert(bVar6,"202 == theStruct.NumFixArray[1]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4fb);
      if (!bVar6) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
    }
    if (theStruct.StructFixArrayCount != 9) {
      bVar6 = theStruct.BoolVarArray == (_Bool *)0x3;
      WjTestLib_Assert(bVar6,"3 == theStruct.BoolVarArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4fe);
      if (!bVar6) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      bVar1 = *(byte *)theStruct.NumFixArrayCount;
      WjTestLib_Assert((_Bool)(bVar1 & 1),"theStruct.BoolVarArray[0]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4ff);
      if ((_Bool)(bVar1 & 1) == false) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      _Var3 = (_Bool)((*(byte *)(theStruct.NumFixArrayCount + 1) ^ 0xff) & 1);
      WjTestLib_Assert(_Var3,"!theStruct.BoolVarArray[1]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x500);
      if (_Var3 == false) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      _Var3 = (_Bool)(*(byte *)(theStruct.NumFixArrayCount + 2) & 1);
      WjTestLib_Assert(_Var3,"theStruct.BoolVarArray[2]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x501);
      if (_Var3 == false) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
    }
    if (theStruct.StructFixArrayCount != 10) {
      bVar6 = theStruct._144_8_ == 3;
      WjTestLib_Assert(bVar6,"3 == theStruct.BoolFixArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x504);
      if (!bVar6) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      _Var3 = (_Bool)((byte)theStruct.BoolVarArrayCount & 1);
      WjTestLib_Assert(_Var3,"theStruct.BoolFixArray[0]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x505);
      if (_Var3 == false) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      _Var3 = (_Bool)((theStruct.BoolVarArrayCount._1_1_ ^ 0xff) & 1);
      WjTestLib_Assert(_Var3,"!theStruct.BoolFixArray[1]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x506);
      if (_Var3 == false) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      _Var3 = (_Bool)(theStruct.BoolVarArrayCount._2_1_ & 1);
      WjTestLib_Assert(_Var3,"theStruct.BoolFixArray[2]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x507);
      if (_Var3 == false) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
    }
    if (theStruct.StructFixArrayCount != 0xb) {
      bVar6 = theStruct.StructVarArray == (MiniStruct *)0x2;
      WjTestLib_Assert(bVar6,"2 == theStruct.StructVarArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x50a);
      if (!bVar6) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      lVar2 = *(long *)theStruct.BoolFixArrayCount;
      WjTestLib_Assert(lVar2 == 0x12d,"301 == theStruct.StructVarArray[0].XNum",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x50b);
      if (lVar2 != 0x12d) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      iVar5 = strcmp(*(char **)(theStruct.BoolFixArrayCount + 8),"301");
      WjTestLib_Assert(iVar5 == 0,"strcmp( theStruct.StructVarArray[0].XStr, \"301\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x50c);
      if (iVar5 != 0) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      bVar6 = *(long *)(theStruct.BoolFixArrayCount + 0x10) == 0x191;
      WjTestLib_Assert(bVar6,"401 == theStruct.StructVarArray[1].XNum",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x50d);
      if (!bVar6) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      iVar5 = strcmp(*(char **)(theStruct.BoolFixArrayCount + 0x18),"401");
      WjTestLib_Assert(iVar5 == 0,"strcmp( theStruct.StructVarArray[1].XStr, \"401\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x50e);
      if (iVar5 != 0) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
    }
    if (theStruct.StructFixArrayCount != 0xc) {
      bVar6 = theStruct.StructFixArray[3].XStr == (char *)0x2;
      WjTestLib_Assert(bVar6,"2 == theStruct.StructFixArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x511);
      if (!bVar6) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      bVar6 = theStruct.StructVarArrayCount == 0x1f5;
      WjTestLib_Assert(bVar6,"501 == theStruct.StructFixArray[0].XNum",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x512);
      if (!bVar6) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      iVar5 = strcmp((char *)theStruct.StructFixArray[0].XNum,"501");
      WjTestLib_Assert(iVar5 == 0,"strcmp( theStruct.StructFixArray[0].XStr, \"501\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x513);
      if (iVar5 != 0) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      bVar6 = theStruct.StructFixArray[0].XStr == (char *)0x259;
      WjTestLib_Assert(bVar6,"601 == theStruct.StructFixArray[1].XNum",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x514);
      if (!bVar6) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
      iVar5 = strcmp((char *)theStruct.StructFixArray[1].XNum,"601");
      WjTestLib_Assert(iVar5 == 0,"strcmp( theStruct.StructFixArray[1].XStr, \"601\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x515);
      if (iVar5 != 0) {
        errorAtPos._4_4_ = WJTL_STATUS_FAILED;
      }
    }
    JVar4 = JlUnmarshallFreeStructAllocs((JlMarshallElement *)&element,0xd,&_result_7);
    WjTestLib_Assert(JVar4 == JL_STATUS_SUCCESS,
                     "((JL_STATUS)(JlUnmarshallFreeStructAllocs( marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                     ,"TestUnmarshallPartialFills",0x518);
    if (JVar4 != JL_STATUS_SUCCESS) {
      errorAtPos._4_4_ = WJTL_STATUS_FAILED;
    }
  }
  return errorAtPos._4_4_;
}

Assistant:

static
WJTL_STATUS
    TestUnmarshallPartialFills
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;
    size_t errorAtPos = 0;

    typedef struct
    {
        uint64_t    XNum;
        char*       XStr;
    } MiniStruct;

    typedef struct
    {
        char        FixStr[10];
        char*       VarStr;
        uint32_t    Num;
        bool        Bool1;
        bool        Bool2;
        char**      StrArray;
        size_t      StrArrayCount;
        char*       StrFixArray[4];
        size_t      StrFixArrayCount;
        uint32_t*   NumVarArray;
        size_t      NumVarArrayCount;
        uint32_t    NumFixArray[4];
        size_t      NumFixArrayCount;
        bool*       BoolVarArray;
        size_t      BoolVarArrayCount;
        bool        BoolFixArray[4];
        size_t      BoolFixArrayCount;
        MiniStruct* StructVarArray;
        size_t      StructVarArrayCount;
        MiniStruct  StructFixArray[4];
        size_t      StructFixArrayCount;
    } TheStruct;

    JlMarshallElement marshalMiniStruct[] = {
        JlMarshallUnsigned( MiniStruct, XNum, "XNum" ),
        JlMarshallString( MiniStruct, XStr, "XStr" ),
    };

    JlMarshallElement marshalTheStruct[] = {
        JlMarshallStringFixed( TheStruct, FixStr, "FixStr" ),
        JlMarshallString( TheStruct, VarStr, "VarStr" ),
        JlMarshallUnsigned( TheStruct, Num, "Num" ),
        JlMarshallBool( TheStruct, Bool1, "Bool1" ),
        JlMarshallBool( TheStruct, Bool2, "Bool2" ),
        JlMarshallStringArray( TheStruct, StrArray, StrArrayCount, "StrVarList" ),
        JlMarshallStringFixedArray( TheStruct, StrFixArray, StrFixArrayCount, "StrFixList" ),
        JlMarshallUnsignedArray( TheStruct, NumVarArray, NumVarArrayCount, "NumVarList" ),
        JlMarshallUnsignedFixedArray( TheStruct, NumFixArray, NumFixArrayCount, "NumFixList" ),
        JlMarshallBoolArray( TheStruct, BoolVarArray, BoolVarArrayCount, "BoolVarList" ),
        JlMarshallBoolFixedArray( TheStruct, BoolFixArray, BoolFixArrayCount, "BoolFixList" ),
        JlMarshallStructArray( TheStruct, StructVarArray, StructVarArrayCount, "MiniVarList", MiniStruct, marshalMiniStruct, NumElements(marshalMiniStruct) ),
        JlMarshallStructFixedArray( TheStruct, StructFixArray, StructFixArrayCount, "MiniFixList", MiniStruct, marshalMiniStruct, NumElements(marshalMiniStruct) ),
    };

    // Test replacing each element individually with new json and verify rest of struct does not get changed
    for( size_t element=1; element<=12; element++ )
    {
        TheStruct theStruct = {{0}};

        // Fill in struct with values
        JL_ASSERT_SUCCESS( JlJsonToStruct(
            "{ \"FixStr\":\"FixStr\", \"VarStr\":\"VarStr\", \"Num\":1234, \"Bool1\":true, \"Bool2\":false,"
            " \"StrVarList\":[\"StrVarList1\",\"StrVarList2\"], \"StrFixList\":[\"StrFixList1\",\"StrFixList2\"],"
            " \"NumVarList\":[101,102], \"NumFixList\":[201,202], \"BoolVarList\":[true,false,true],"
            " \"BoolFixList\":[true,false,true],"
            " \"MiniVarList\": [ {\"XNum\":301,\"XStr\":\"301\"}, {\"XNum\":401,\"XStr\":\"401\"} ],"
            " \"MiniFixList\": [ {\"XNum\":501,\"XStr\":\"501\"}, {\"XNum\":601,\"XStr\":\"601\"} ] }",
             marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
        JL_ASSERT( 0 == errorAtPos );

        switch( element )
        {
        case 1:
            JL_ASSERT_SUCCESS( JlJsonToStruct( "{\"FixStr\":\"XXXX\"}", marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
            JL_ASSERT( strcmp( theStruct.FixStr, "XXXX" ) == 0 );
            break;
        case 2:
            JL_ASSERT_SUCCESS( JlJsonToStruct( "{\"VarStr\":\"XXXX\"}", marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
            JL_ASSERT( strcmp( theStruct.VarStr, "XXXX" ) == 0 );
            break;
        case 3:
            JL_ASSERT_SUCCESS( JlJsonToStruct( "{\"Num\":9999}", marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
            JL_ASSERT( 9999 == theStruct.Num );
            break;
        case 4:
            JL_ASSERT_SUCCESS( JlJsonToStruct( "{\"Bool1\":false,\"Bool2\":true}", marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
            JL_ASSERT( !theStruct.Bool1 );
            JL_ASSERT( theStruct.Bool2 );
            break;
        case 5:
            JL_ASSERT_SUCCESS( JlJsonToStruct( "{\"StrVarList\":[\"a\",\"b\",\"c\"]}", marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
            JL_ASSERT( 3 == theStruct.StrArrayCount );
            JL_ASSERT( strcmp( theStruct.StrArray[0], "a" ) == 0 );
            JL_ASSERT( strcmp( theStruct.StrArray[1], "b" ) == 0 );
            JL_ASSERT( strcmp( theStruct.StrArray[2], "c" ) == 0 );
            break;
        case 6:
            JL_ASSERT_SUCCESS( JlJsonToStruct( "{\"StrFixList\":[\"a\",\"b\",\"c\"]}", marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
            JL_ASSERT( 3 == theStruct.StrFixArrayCount );
            JL_ASSERT( strcmp( theStruct.StrFixArray[0], "a" ) == 0 );
            JL_ASSERT( strcmp( theStruct.StrFixArray[1], "b" ) == 0 );
            JL_ASSERT( strcmp( theStruct.StrFixArray[2], "c" ) == 0 );
            break;
        case 7:
            JL_ASSERT_SUCCESS( JlJsonToStruct( "{\"NumVarList\":[10,20,30]}", marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
            JL_ASSERT( 3 == theStruct.NumVarArrayCount );
            JL_ASSERT( 10 == theStruct.NumVarArray[0] );
            JL_ASSERT( 20 == theStruct.NumVarArray[1] );
            JL_ASSERT( 30 == theStruct.NumVarArray[2] );
            break;
        case 8:
            JL_ASSERT_SUCCESS( JlJsonToStruct( "{\"NumFixList\":[10,20,30]}", marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
            JL_ASSERT( 3 == theStruct.NumFixArrayCount );
            JL_ASSERT( 10 == theStruct.NumFixArray[0] );
            JL_ASSERT( 20 == theStruct.NumFixArray[1] );
            JL_ASSERT( 30 == theStruct.NumFixArray[2] );
            break;
        case 9:
            JL_ASSERT_SUCCESS( JlJsonToStruct( "{\"BoolVarList\":[false,true,false,true]}", marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
            JL_ASSERT( 4 == theStruct.BoolVarArrayCount );
            JL_ASSERT( !theStruct.BoolVarArray[0] );
            JL_ASSERT( theStruct.BoolVarArray[1] );
            JL_ASSERT( !theStruct.BoolVarArray[2] );
            JL_ASSERT( theStruct.BoolVarArray[3] );
            break;
        case 10:
            JL_ASSERT_SUCCESS( JlJsonToStruct( "{\"BoolFixList\":[false,true,false,true]}", marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
            JL_ASSERT( 4 == theStruct.BoolFixArrayCount );
            JL_ASSERT( !theStruct.BoolFixArray[0] );
            JL_ASSERT( theStruct.BoolFixArray[1] );
            JL_ASSERT( !theStruct.BoolFixArray[2] );
            JL_ASSERT( theStruct.BoolFixArray[3] );
            break;
        case 11:
            JL_ASSERT_SUCCESS( JlJsonToStruct( "{\"MiniVarList\": [ {\"XNum\":777,\"XStr\":\"777\"}, {\"XNum\":888,\"XStr\":\"888\"}, {\"XNum\":999,\"XStr\":\"999\"} ]}", marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
            JL_ASSERT( 3 == theStruct.StructVarArrayCount );
            JL_ASSERT( 777 == theStruct.StructVarArray[0].XNum );
            JL_ASSERT( strcmp( theStruct.StructVarArray[0].XStr, "777" ) == 0 );
            JL_ASSERT( 888 == theStruct.StructVarArray[1].XNum );
            JL_ASSERT( strcmp( theStruct.StructVarArray[1].XStr, "888" ) == 0 );
            JL_ASSERT( 999 == theStruct.StructVarArray[2].XNum );
            JL_ASSERT( strcmp( theStruct.StructVarArray[2].XStr, "999" ) == 0 );
            break;
        case 12:
            JL_ASSERT_SUCCESS( JlJsonToStruct( "{\"MiniFixList\": [ {\"XNum\":777,\"XStr\":\"777\"}, {\"XNum\":888,\"XStr\":\"888\"}, {\"XNum\":999,\"XStr\":\"999\"} ]}", marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
            JL_ASSERT( 3 == theStruct.StructFixArrayCount );
            JL_ASSERT( 777 == theStruct.StructFixArray[0].XNum );
            JL_ASSERT( strcmp( theStruct.StructFixArray[0].XStr, "777" ) == 0 );
            JL_ASSERT( 888 == theStruct.StructFixArray[1].XNum );
            JL_ASSERT( strcmp( theStruct.StructFixArray[1].XStr, "888" ) == 0 );
            JL_ASSERT( 999 == theStruct.StructFixArray[2].XNum );
            JL_ASSERT( strcmp( theStruct.StructFixArray[2].XStr, "999" ) == 0 );
            break;
        default:
            JL_ASSERT( false );
            break;
        }

        // Verify every other element is still there
        if( 1 != element ) { JL_ASSERT( strcmp( theStruct.FixStr, "FixStr" ) == 0 ); }
        if( 2 != element ) { JL_ASSERT( strcmp( theStruct.VarStr, "VarStr" ) == 0 ); }
        if( 3 != element ) { JL_ASSERT( 1234 == theStruct.Num ); }
        if( 4 != element ) {
            JL_ASSERT( theStruct.Bool1 );
            JL_ASSERT( !theStruct.Bool2 );
        }
        if( 5 != element ) {
            JL_ASSERT( 2 == theStruct.StrArrayCount );
            JL_ASSERT( strcmp( theStruct.StrArray[0], "StrVarList1" ) == 0 );
            JL_ASSERT( strcmp( theStruct.StrArray[1], "StrVarList2" ) == 0 );
        }
        if( 6 != element ) {
            JL_ASSERT( 2 == theStruct.StrFixArrayCount );
            JL_ASSERT( strcmp( theStruct.StrFixArray[0], "StrFixList1" ) == 0 );
            JL_ASSERT( strcmp( theStruct.StrFixArray[1], "StrFixList2" ) == 0 );
        }
        if( 7 != element ) {
            JL_ASSERT( 2 == theStruct.NumVarArrayCount );
            JL_ASSERT( 101 == theStruct.NumVarArray[0] );
            JL_ASSERT( 102 == theStruct.NumVarArray[1] );
        }
        if( 8 != element ) {
            JL_ASSERT( 2 == theStruct.NumFixArrayCount );
            JL_ASSERT( 201 == theStruct.NumFixArray[0] );
            JL_ASSERT( 202 == theStruct.NumFixArray[1] );
        }
        if( 9 != element ) {
            JL_ASSERT( 3 == theStruct.BoolVarArrayCount );
            JL_ASSERT( theStruct.BoolVarArray[0] );
            JL_ASSERT( !theStruct.BoolVarArray[1] );
            JL_ASSERT( theStruct.BoolVarArray[2] );
        }
        if( 10 != element ) {
            JL_ASSERT( 3 == theStruct.BoolFixArrayCount );
            JL_ASSERT( theStruct.BoolFixArray[0] );
            JL_ASSERT( !theStruct.BoolFixArray[1] );
            JL_ASSERT( theStruct.BoolFixArray[2] );
        }
        if( 11 != element ) {
            JL_ASSERT( 2 == theStruct.StructVarArrayCount );
            JL_ASSERT( 301 == theStruct.StructVarArray[0].XNum );
            JL_ASSERT( strcmp( theStruct.StructVarArray[0].XStr, "301" ) == 0 );
            JL_ASSERT( 401 == theStruct.StructVarArray[1].XNum );
            JL_ASSERT( strcmp( theStruct.StructVarArray[1].XStr, "401" ) == 0 );
        }
        if( 12 != element ) {
            JL_ASSERT( 2 == theStruct.StructFixArrayCount );
            JL_ASSERT( 501 == theStruct.StructFixArray[0].XNum );
            JL_ASSERT( strcmp( theStruct.StructFixArray[0].XStr, "501" ) == 0 );
            JL_ASSERT( 601 == theStruct.StructFixArray[1].XNum );
            JL_ASSERT( strcmp( theStruct.StructFixArray[1].XStr, "601" ) == 0 );
        }

        JL_ASSERT_SUCCESS( JlUnmarshallFreeStructAllocs( marshalTheStruct, NumElements(marshalTheStruct), &theStruct ) );
    }

    return TestReturn;
}